

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  int iVar1;
  undefined4 uVar2;
  RTCFilterFunctionN p_Var3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  ulong uVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  bool bVar56;
  bool bVar57;
  bool bVar58;
  bool bVar59;
  ulong uVar60;
  long lVar61;
  long lVar62;
  ulong uVar63;
  ulong uVar64;
  ulong uVar65;
  ulong *puVar66;
  ulong uVar67;
  ulong uVar68;
  uint uVar69;
  undefined4 uVar70;
  ulong unaff_R14;
  size_t mask;
  bool bVar71;
  bool bVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [64];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [64];
  float fVar96;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [64];
  float fVar111;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar114 [64];
  undefined1 auVar121 [32];
  undefined1 auVar122 [64];
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar123 [32];
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar129 [32];
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar142 [32];
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar149 [32];
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 auVar156 [32];
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined8 local_1870;
  undefined8 uStack_1868;
  undefined8 *local_1860;
  ulong local_1858;
  ulong *local_1850;
  ulong local_1848;
  undefined1 local_1840 [32];
  Scene *local_1820;
  undefined1 auStack_1818 [24];
  RTCFilterFunctionNArguments local_17f0;
  float local_17c0;
  float fStack_17bc;
  float fStack_17b8;
  float fStack_17b4;
  float fStack_17b0;
  float fStack_17ac;
  float fStack_17a8;
  float fStack_17a4;
  float local_17a0;
  float fStack_179c;
  float fStack_1798;
  float fStack_1794;
  float fStack_1790;
  float fStack_178c;
  float fStack_1788;
  float fStack_1784;
  float local_1780;
  float fStack_177c;
  float fStack_1778;
  float fStack_1774;
  float fStack_1770;
  float fStack_176c;
  float fStack_1768;
  float fStack_1764;
  float local_1760;
  float fStack_175c;
  float fStack_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float fStack_1748;
  float fStack_1744;
  float local_1740;
  float fStack_173c;
  float fStack_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float fStack_1728;
  float fStack_1724;
  float local_1720;
  float fStack_171c;
  float fStack_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float fStack_1708;
  float fStack_1704;
  undefined1 local_1700 [32];
  undefined1 local_16e0 [32];
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [32];
  undefined1 local_1680 [32];
  undefined1 local_1660 [32];
  undefined1 local_1640 [32];
  undefined4 local_1610;
  undefined4 uStack_160c;
  undefined4 uStack_1608;
  undefined4 uStack_1604;
  undefined1 local_1600 [16];
  undefined1 local_15f0 [16];
  undefined1 local_15e0 [16];
  undefined1 local_15d0 [16];
  undefined4 local_15c0;
  undefined4 uStack_15bc;
  undefined4 uStack_15b8;
  undefined4 uStack_15b4;
  undefined1 local_15b0 [16];
  uint local_15a0;
  uint uStack_159c;
  uint uStack_1598;
  uint uStack_1594;
  uint uStack_1590;
  uint uStack_158c;
  uint uStack_1588;
  uint uStack_1584;
  undefined1 local_1580 [8];
  float fStack_1578;
  float fStack_1574;
  float fStack_1570;
  float fStack_156c;
  float fStack_1568;
  undefined4 uStack_1564;
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  float local_14a0;
  float fStack_149c;
  float fStack_1498;
  float fStack_1494;
  float fStack_1490;
  float fStack_148c;
  float fStack_1488;
  float fStack_1484;
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  undefined4 uStack_13b0;
  undefined4 uStack_13ac;
  undefined4 uStack_13a8;
  undefined4 uStack_13a4;
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  undefined4 uStack_1264;
  undefined1 local_1260 [32];
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  undefined1 local_1220 [32];
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1200 = root.ptr;
  uVar70 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_16c0._4_4_ = uVar70;
  local_16c0._0_4_ = uVar70;
  local_16c0._8_4_ = uVar70;
  local_16c0._12_4_ = uVar70;
  local_16c0._16_4_ = uVar70;
  local_16c0._20_4_ = uVar70;
  local_16c0._24_4_ = uVar70;
  local_16c0._28_4_ = uVar70;
  auVar110 = ZEXT3264(local_16c0);
  uVar70 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_16e0._4_4_ = uVar70;
  local_16e0._0_4_ = uVar70;
  local_16e0._8_4_ = uVar70;
  local_16e0._12_4_ = uVar70;
  local_16e0._16_4_ = uVar70;
  local_16e0._20_4_ = uVar70;
  local_16e0._24_4_ = uVar70;
  local_16e0._28_4_ = uVar70;
  auVar114 = ZEXT3264(local_16e0);
  uVar70 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1700._4_4_ = uVar70;
  local_1700._0_4_ = uVar70;
  local_1700._8_4_ = uVar70;
  local_1700._12_4_ = uVar70;
  local_1700._16_4_ = uVar70;
  local_1700._20_4_ = uVar70;
  local_1700._24_4_ = uVar70;
  local_1700._28_4_ = uVar70;
  auVar122 = ZEXT3264(local_1700);
  fVar111 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar115 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar116 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar117 = fVar111 * 0.99999964;
  fVar118 = fVar115 * 0.99999964;
  fVar119 = fVar116 * 0.99999964;
  fVar111 = fVar111 * 1.0000004;
  fVar115 = fVar115 * 1.0000004;
  fVar116 = fVar116 * 1.0000004;
  uVar67 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar68 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar63 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar1 = (tray->tnear).field_0.i[k];
  local_1680._4_4_ = iVar1;
  local_1680._0_4_ = iVar1;
  local_1680._8_4_ = iVar1;
  local_1680._12_4_ = iVar1;
  local_1680._16_4_ = iVar1;
  local_1680._20_4_ = iVar1;
  local_1680._24_4_ = iVar1;
  local_1680._28_4_ = iVar1;
  auVar90 = ZEXT3264(local_1680);
  iVar1 = (tray->tfar).field_0.i[k];
  local_16a0._4_4_ = iVar1;
  local_16a0._0_4_ = iVar1;
  local_16a0._8_4_ = iVar1;
  local_16a0._12_4_ = iVar1;
  local_16a0._16_4_ = iVar1;
  local_16a0._20_4_ = iVar1;
  local_16a0._24_4_ = iVar1;
  local_16a0._28_4_ = iVar1;
  auVar95 = ZEXT3264(local_16a0);
  local_1560._16_16_ = mm_lookupmask_ps._240_16_;
  local_1560._0_16_ = mm_lookupmask_ps._0_16_;
  local_1848 = uVar63 ^ 0x20;
  local_1860 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar83._8_4_ = 0x3f800000;
  auVar83._0_8_ = &DAT_3f8000003f800000;
  auVar83._12_4_ = 0x3f800000;
  auVar83._16_4_ = 0x3f800000;
  auVar83._20_4_ = 0x3f800000;
  auVar83._24_4_ = 0x3f800000;
  auVar83._28_4_ = 0x3f800000;
  auVar74._8_4_ = 0xbf800000;
  auVar74._0_8_ = 0xbf800000bf800000;
  auVar74._12_4_ = 0xbf800000;
  auVar74._16_4_ = 0xbf800000;
  auVar74._20_4_ = 0xbf800000;
  auVar74._24_4_ = 0xbf800000;
  auVar74._28_4_ = 0xbf800000;
  _local_1580 = vblendvps_avx(auVar83,auVar74,local_1560);
  puVar66 = local_11f8;
  fVar120 = fVar117;
  fVar124 = fVar117;
  fVar125 = fVar117;
  fVar126 = fVar117;
  fVar127 = fVar117;
  fVar128 = fVar117;
  fVar130 = fVar118;
  fVar131 = fVar118;
  fVar132 = fVar118;
  fVar133 = fVar118;
  fVar134 = fVar118;
  fVar135 = fVar118;
  fVar136 = fVar119;
  fVar137 = fVar119;
  fVar138 = fVar119;
  fVar139 = fVar119;
  fVar140 = fVar119;
  fVar141 = fVar119;
  fVar143 = fVar111;
  fVar144 = fVar111;
  fVar145 = fVar111;
  fVar146 = fVar111;
  fVar147 = fVar111;
  fVar148 = fVar111;
  fVar150 = fVar115;
  fVar151 = fVar115;
  fVar152 = fVar115;
  fVar153 = fVar115;
  fVar154 = fVar115;
  fVar155 = fVar115;
  fVar157 = fVar116;
  fVar158 = fVar116;
  fVar159 = fVar116;
  fVar160 = fVar116;
  fVar161 = fVar116;
  fVar162 = fVar116;
  local_17c0 = fVar116;
  fStack_17bc = fVar116;
  fStack_17b8 = fVar116;
  fStack_17b4 = fVar116;
  fStack_17b0 = fVar116;
  fStack_17ac = fVar116;
  fStack_17a8 = fVar116;
  fStack_17a4 = fVar116;
  local_17a0 = fVar115;
  fStack_179c = fVar115;
  fStack_1798 = fVar115;
  fStack_1794 = fVar115;
  fStack_1790 = fVar115;
  fStack_178c = fVar115;
  fStack_1788 = fVar115;
  fStack_1784 = fVar115;
  local_1780 = fVar111;
  fStack_177c = fVar111;
  fStack_1778 = fVar111;
  fStack_1774 = fVar111;
  fStack_1770 = fVar111;
  fStack_176c = fVar111;
  fStack_1768 = fVar111;
  fStack_1764 = fVar111;
  local_1760 = fVar119;
  fStack_175c = fVar119;
  fStack_1758 = fVar119;
  fStack_1754 = fVar119;
  fStack_1750 = fVar119;
  fStack_174c = fVar119;
  fStack_1748 = fVar119;
  fStack_1744 = fVar119;
  local_1740 = fVar118;
  fStack_173c = fVar118;
  fStack_1738 = fVar118;
  fStack_1734 = fVar118;
  fStack_1730 = fVar118;
  fStack_172c = fVar118;
  fStack_1728 = fVar118;
  fStack_1724 = fVar118;
  local_1720 = fVar117;
  fStack_171c = fVar117;
  fStack_1718 = fVar117;
  fStack_1714 = fVar117;
  fStack_1710 = fVar117;
  fStack_170c = fVar117;
  fStack_1708 = fVar117;
  fStack_1704 = fVar117;
  do {
    local_1850 = puVar66;
    if (local_1850 == &local_1200) break;
    puVar66 = local_1850 + -1;
    uVar65 = local_1850[-1];
    do {
      if ((uVar65 & 8) == 0) {
        auVar74 = vsubps_avx(*(undefined1 (*) [32])(uVar65 + 0x40 + uVar67),auVar110._0_32_);
        auVar81._4_4_ = fVar120 * auVar74._4_4_;
        auVar81._0_4_ = fVar117 * auVar74._0_4_;
        auVar81._8_4_ = fVar124 * auVar74._8_4_;
        auVar81._12_4_ = fVar125 * auVar74._12_4_;
        auVar81._16_4_ = fVar126 * auVar74._16_4_;
        auVar81._20_4_ = fVar127 * auVar74._20_4_;
        auVar81._24_4_ = fVar128 * auVar74._24_4_;
        auVar81._28_4_ = auVar74._28_4_;
        auVar74 = vsubps_avx(*(undefined1 (*) [32])(uVar65 + 0x40 + uVar68),auVar114._0_32_);
        auVar25._4_4_ = fVar130 * auVar74._4_4_;
        auVar25._0_4_ = fVar118 * auVar74._0_4_;
        auVar25._8_4_ = fVar131 * auVar74._8_4_;
        auVar25._12_4_ = fVar132 * auVar74._12_4_;
        auVar25._16_4_ = fVar133 * auVar74._16_4_;
        auVar25._20_4_ = fVar134 * auVar74._20_4_;
        auVar25._24_4_ = fVar135 * auVar74._24_4_;
        auVar25._28_4_ = auVar74._28_4_;
        auVar74 = vmaxps_avx(auVar81,auVar25);
        auVar83 = vsubps_avx(*(undefined1 (*) [32])(uVar65 + 0x40 + uVar63),auVar122._0_32_);
        auVar26._4_4_ = fVar136 * auVar83._4_4_;
        auVar26._0_4_ = fVar119 * auVar83._0_4_;
        auVar26._8_4_ = fVar137 * auVar83._8_4_;
        auVar26._12_4_ = fVar138 * auVar83._12_4_;
        auVar26._16_4_ = fVar139 * auVar83._16_4_;
        auVar26._20_4_ = fVar140 * auVar83._20_4_;
        auVar26._24_4_ = fVar141 * auVar83._24_4_;
        auVar26._28_4_ = auVar83._28_4_;
        auVar83 = vmaxps_avx(auVar26,auVar90._0_32_);
        auVar74 = vmaxps_avx(auVar74,auVar83);
        auVar83 = vsubps_avx(*(undefined1 (*) [32])(uVar65 + 0x40 + (uVar67 ^ 0x20)),auVar110._0_32_
                            );
        auVar27._4_4_ = fVar143 * auVar83._4_4_;
        auVar27._0_4_ = fVar111 * auVar83._0_4_;
        auVar27._8_4_ = fVar144 * auVar83._8_4_;
        auVar27._12_4_ = fVar145 * auVar83._12_4_;
        auVar27._16_4_ = fVar146 * auVar83._16_4_;
        auVar27._20_4_ = fVar147 * auVar83._20_4_;
        auVar27._24_4_ = fVar148 * auVar83._24_4_;
        auVar27._28_4_ = auVar83._28_4_;
        auVar83 = vsubps_avx(*(undefined1 (*) [32])(uVar65 + 0x40 + (uVar68 ^ 0x20)),auVar114._0_32_
                            );
        auVar28._4_4_ = fVar150 * auVar83._4_4_;
        auVar28._0_4_ = fVar115 * auVar83._0_4_;
        auVar28._8_4_ = fVar151 * auVar83._8_4_;
        auVar28._12_4_ = fVar152 * auVar83._12_4_;
        auVar28._16_4_ = fVar153 * auVar83._16_4_;
        auVar28._20_4_ = fVar154 * auVar83._20_4_;
        auVar28._24_4_ = fVar155 * auVar83._24_4_;
        auVar28._28_4_ = auVar83._28_4_;
        auVar83 = vminps_avx(auVar27,auVar28);
        auVar81 = vsubps_avx(*(undefined1 (*) [32])(uVar65 + 0x40 + local_1848),auVar122._0_32_);
        auVar34._4_4_ = fVar157 * auVar81._4_4_;
        auVar34._0_4_ = fVar116 * auVar81._0_4_;
        auVar34._8_4_ = fVar158 * auVar81._8_4_;
        auVar34._12_4_ = fVar159 * auVar81._12_4_;
        auVar34._16_4_ = fVar160 * auVar81._16_4_;
        auVar34._20_4_ = fVar161 * auVar81._20_4_;
        auVar34._24_4_ = fVar162 * auVar81._24_4_;
        auVar34._28_4_ = auVar81._28_4_;
        auVar81 = vminps_avx(auVar34,auVar95._0_32_);
        auVar83 = vminps_avx(auVar83,auVar81);
        auVar74 = vcmpps_avx(auVar74,auVar83,2);
        uVar70 = vmovmskps_avx(auVar74);
        unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),uVar70);
      }
      if ((uVar65 & 8) == 0) {
        if (unaff_R14 == 0) {
          uVar69 = 4;
        }
        else {
          uVar64 = uVar65 & 0xfffffffffffffff0;
          lVar62 = 0;
          for (uVar65 = unaff_R14; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
            lVar62 = lVar62 + 1;
          }
          uVar69 = 0;
          for (uVar60 = unaff_R14 - 1 & unaff_R14; uVar65 = *(ulong *)(uVar64 + lVar62 * 8),
              uVar60 != 0; uVar60 = uVar60 - 1 & uVar60) {
            *puVar66 = uVar65;
            puVar66 = puVar66 + 1;
            lVar62 = 0;
            for (uVar65 = uVar60; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
              lVar62 = lVar62 + 1;
            }
          }
        }
      }
      else {
        uVar69 = 6;
      }
    } while (uVar69 == 0);
    if (uVar69 == 6) {
      uVar69 = 0;
      local_1858 = (ulong)((uint)uVar65 & 0xf) - 8;
      bVar71 = local_1858 != 0;
      if (bVar71) {
        uVar65 = uVar65 & 0xfffffffffffffff0;
        uVar64 = 0;
        do {
          lVar61 = uVar64 * 0xe0;
          lVar62 = uVar65 + 0xd0 + lVar61;
          local_1400 = *(undefined8 *)(lVar62 + 0x10);
          uStack_13f8 = *(undefined8 *)(lVar62 + 0x18);
          lVar62 = uVar65 + 0xc0 + lVar61;
          local_13e0 = *(undefined8 *)(lVar62 + 0x10);
          uStack_13d8 = *(undefined8 *)(lVar62 + 0x18);
          uStack_13d0 = local_13e0;
          uStack_13c8 = uStack_13d8;
          uStack_13f0 = local_1400;
          uStack_13e8 = uStack_13f8;
          auVar75._16_16_ = *(undefined1 (*) [16])(uVar65 + 0x60 + lVar61);
          auVar75._0_16_ = *(undefined1 (*) [16])(uVar65 + lVar61);
          auVar77._16_16_ = *(undefined1 (*) [16])(uVar65 + 0x70 + lVar61);
          auVar77._0_16_ = *(undefined1 (*) [16])(uVar65 + 0x10 + lVar61);
          auVar84._16_16_ = *(undefined1 (*) [16])(uVar65 + 0x80 + lVar61);
          auVar84._0_16_ = *(undefined1 (*) [16])(uVar65 + 0x20 + lVar61);
          auVar73 = *(undefined1 (*) [16])(uVar65 + 0x30 + lVar61);
          auVar88._16_16_ = auVar73;
          auVar88._0_16_ = auVar73;
          auVar73 = *(undefined1 (*) [16])(uVar65 + 0x40 + lVar61);
          auVar91._16_16_ = auVar73;
          auVar91._0_16_ = auVar73;
          auVar73 = *(undefined1 (*) [16])(uVar65 + 0x50 + lVar61);
          auVar97._16_16_ = auVar73;
          auVar97._0_16_ = auVar73;
          auVar73 = *(undefined1 (*) [16])(uVar65 + 0x90 + lVar61);
          auVar106._16_16_ = auVar73;
          auVar106._0_16_ = auVar73;
          auVar73 = *(undefined1 (*) [16])(uVar65 + 0xa0 + lVar61);
          auVar156._16_16_ = auVar73;
          auVar156._0_16_ = auVar73;
          auVar73 = *(undefined1 (*) [16])(uVar65 + 0xb0 + lVar61);
          auVar108._16_16_ = auVar73;
          auVar108._0_16_ = auVar73;
          uVar70 = *(undefined4 *)(ray + k * 4);
          auVar129._4_4_ = uVar70;
          auVar129._0_4_ = uVar70;
          auVar129._8_4_ = uVar70;
          auVar129._12_4_ = uVar70;
          auVar129._16_4_ = uVar70;
          auVar129._20_4_ = uVar70;
          auVar129._24_4_ = uVar70;
          auVar129._28_4_ = uVar70;
          uVar70 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar142._4_4_ = uVar70;
          auVar142._0_4_ = uVar70;
          auVar142._8_4_ = uVar70;
          auVar142._12_4_ = uVar70;
          auVar142._16_4_ = uVar70;
          auVar142._20_4_ = uVar70;
          auVar142._24_4_ = uVar70;
          auVar142._28_4_ = uVar70;
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar149._4_4_ = uVar2;
          auVar149._0_4_ = uVar2;
          auVar149._8_4_ = uVar2;
          auVar149._12_4_ = uVar2;
          auVar149._16_4_ = uVar2;
          auVar149._20_4_ = uVar2;
          auVar149._24_4_ = uVar2;
          auVar149._28_4_ = uVar2;
          local_1640 = vsubps_avx(auVar75,auVar129);
          local_1660 = vsubps_avx(auVar77,auVar142);
          local_1420 = vsubps_avx(auVar84,auVar149);
          auVar74 = vsubps_avx(auVar88,auVar129);
          auVar83 = vsubps_avx(auVar91,auVar142);
          auVar81 = vsubps_avx(auVar97,auVar149);
          auVar25 = vsubps_avx(auVar106,auVar129);
          auVar26 = vsubps_avx(auVar156,auVar142);
          auVar27 = vsubps_avx(auVar108,auVar149);
          local_1440 = vsubps_avx(auVar25,local_1640);
          local_1480 = vsubps_avx(auVar26,local_1660);
          local_1460 = vsubps_avx(auVar27,local_1420);
          auVar76._0_4_ = auVar25._0_4_ + local_1640._0_4_;
          auVar76._4_4_ = auVar25._4_4_ + local_1640._4_4_;
          auVar76._8_4_ = auVar25._8_4_ + local_1640._8_4_;
          auVar76._12_4_ = auVar25._12_4_ + local_1640._12_4_;
          auVar76._16_4_ = auVar25._16_4_ + local_1640._16_4_;
          auVar76._20_4_ = auVar25._20_4_ + local_1640._20_4_;
          auVar76._24_4_ = auVar25._24_4_ + local_1640._24_4_;
          auVar76._28_4_ = auVar25._28_4_ + local_1640._28_4_;
          auVar89._0_4_ = auVar26._0_4_ + local_1660._0_4_;
          auVar89._4_4_ = auVar26._4_4_ + local_1660._4_4_;
          auVar89._8_4_ = auVar26._8_4_ + local_1660._8_4_;
          auVar89._12_4_ = auVar26._12_4_ + local_1660._12_4_;
          auVar89._16_4_ = auVar26._16_4_ + local_1660._16_4_;
          auVar89._20_4_ = auVar26._20_4_ + local_1660._20_4_;
          auVar89._24_4_ = auVar26._24_4_ + local_1660._24_4_;
          auVar89._28_4_ = auVar26._28_4_ + local_1660._28_4_;
          fVar4 = local_1420._0_4_;
          auVar92._0_4_ = auVar27._0_4_ + fVar4;
          fVar5 = local_1420._4_4_;
          auVar92._4_4_ = auVar27._4_4_ + fVar5;
          fVar6 = local_1420._8_4_;
          auVar92._8_4_ = auVar27._8_4_ + fVar6;
          fVar7 = local_1420._12_4_;
          auVar92._12_4_ = auVar27._12_4_ + fVar7;
          fVar8 = local_1420._16_4_;
          auVar92._16_4_ = auVar27._16_4_ + fVar8;
          fVar9 = local_1420._20_4_;
          auVar92._20_4_ = auVar27._20_4_ + fVar9;
          fVar10 = local_1420._24_4_;
          fVar116 = auVar27._28_4_;
          auVar92._24_4_ = auVar27._24_4_ + fVar10;
          fVar111 = local_1420._28_4_;
          auVar92._28_4_ = fVar116 + fVar111;
          auVar35._4_4_ = local_1460._4_4_ * auVar89._4_4_;
          auVar35._0_4_ = local_1460._0_4_ * auVar89._0_4_;
          auVar35._8_4_ = local_1460._8_4_ * auVar89._8_4_;
          auVar35._12_4_ = local_1460._12_4_ * auVar89._12_4_;
          auVar35._16_4_ = local_1460._16_4_ * auVar89._16_4_;
          auVar35._20_4_ = local_1460._20_4_ * auVar89._20_4_;
          auVar35._24_4_ = local_1460._24_4_ * auVar89._24_4_;
          auVar35._28_4_ = uVar70;
          auVar31 = vfmsub231ps_fma(auVar35,local_1480,auVar92);
          auVar36._4_4_ = auVar92._4_4_ * local_1440._4_4_;
          auVar36._0_4_ = auVar92._0_4_ * local_1440._0_4_;
          auVar36._8_4_ = auVar92._8_4_ * local_1440._8_4_;
          auVar36._12_4_ = auVar92._12_4_ * local_1440._12_4_;
          auVar36._16_4_ = auVar92._16_4_ * local_1440._16_4_;
          auVar36._20_4_ = auVar92._20_4_ * local_1440._20_4_;
          auVar36._24_4_ = auVar92._24_4_ * local_1440._24_4_;
          auVar36._28_4_ = auVar92._28_4_;
          auVar73 = vfmsub231ps_fma(auVar36,local_1460,auVar76);
          auVar37._4_4_ = auVar76._4_4_ * local_1480._4_4_;
          auVar37._0_4_ = auVar76._0_4_ * local_1480._0_4_;
          auVar37._8_4_ = auVar76._8_4_ * local_1480._8_4_;
          auVar37._12_4_ = auVar76._12_4_ * local_1480._12_4_;
          auVar37._16_4_ = auVar76._16_4_ * local_1480._16_4_;
          auVar37._20_4_ = auVar76._20_4_ * local_1480._20_4_;
          auVar37._24_4_ = auVar76._24_4_ * local_1480._24_4_;
          auVar37._28_4_ = auVar76._28_4_;
          auVar82 = vfmsub231ps_fma(auVar37,local_1440,auVar89);
          uVar70 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar109._4_4_ = uVar70;
          auVar109._0_4_ = uVar70;
          auVar109._8_4_ = uVar70;
          auVar109._12_4_ = uVar70;
          auVar109._16_4_ = uVar70;
          auVar109._20_4_ = uVar70;
          auVar109._24_4_ = uVar70;
          auVar109._28_4_ = uVar70;
          local_14a0 = *(float *)(ray + k * 4 + 0x60);
          auVar38._4_4_ = local_14a0 * auVar82._4_4_;
          auVar38._0_4_ = local_14a0 * auVar82._0_4_;
          auVar38._8_4_ = local_14a0 * auVar82._8_4_;
          auVar38._12_4_ = local_14a0 * auVar82._12_4_;
          auVar38._16_4_ = local_14a0 * 0.0;
          auVar38._20_4_ = local_14a0 * 0.0;
          auVar38._24_4_ = local_14a0 * 0.0;
          auVar38._28_4_ = auVar89._28_4_;
          auVar73 = vfmadd231ps_fma(auVar38,auVar109,ZEXT1632(auVar73));
          uVar70 = *(undefined4 *)(ray + k * 4 + 0x40);
          local_1840._4_4_ = uVar70;
          local_1840._0_4_ = uVar70;
          local_1840._8_4_ = uVar70;
          local_1840._12_4_ = uVar70;
          local_1840._16_4_ = uVar70;
          local_1840._20_4_ = uVar70;
          local_1840._24_4_ = uVar70;
          local_1840._28_4_ = uVar70;
          auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),local_1840,ZEXT1632(auVar31));
          local_14c0 = vsubps_avx(local_1660,auVar83);
          local_1500 = vsubps_avx(local_1420,auVar81);
          auVar98._0_4_ = auVar83._0_4_ + local_1660._0_4_;
          auVar98._4_4_ = auVar83._4_4_ + local_1660._4_4_;
          auVar98._8_4_ = auVar83._8_4_ + local_1660._8_4_;
          auVar98._12_4_ = auVar83._12_4_ + local_1660._12_4_;
          auVar98._16_4_ = auVar83._16_4_ + local_1660._16_4_;
          auVar98._20_4_ = auVar83._20_4_ + local_1660._20_4_;
          auVar98._24_4_ = auVar83._24_4_ + local_1660._24_4_;
          auVar98._28_4_ = auVar83._28_4_ + local_1660._28_4_;
          auVar93._0_4_ = fVar4 + auVar81._0_4_;
          auVar93._4_4_ = fVar5 + auVar81._4_4_;
          auVar93._8_4_ = fVar6 + auVar81._8_4_;
          auVar93._12_4_ = fVar7 + auVar81._12_4_;
          auVar93._16_4_ = fVar8 + auVar81._16_4_;
          auVar93._20_4_ = fVar9 + auVar81._20_4_;
          auVar93._24_4_ = fVar10 + auVar81._24_4_;
          fVar115 = auVar81._28_4_;
          auVar93._28_4_ = fVar111 + fVar115;
          fVar96 = local_1500._0_4_;
          fVar102 = local_1500._4_4_;
          auVar39._4_4_ = auVar98._4_4_ * fVar102;
          auVar39._0_4_ = auVar98._0_4_ * fVar96;
          fVar105 = local_1500._8_4_;
          auVar39._8_4_ = auVar98._8_4_ * fVar105;
          fVar13 = local_1500._12_4_;
          auVar39._12_4_ = auVar98._12_4_ * fVar13;
          fVar16 = local_1500._16_4_;
          auVar39._16_4_ = auVar98._16_4_ * fVar16;
          fVar19 = local_1500._20_4_;
          auVar39._20_4_ = auVar98._20_4_ * fVar19;
          fVar22 = local_1500._24_4_;
          auVar39._24_4_ = auVar98._24_4_ * fVar22;
          auVar39._28_4_ = fVar111;
          auVar82 = vfmsub231ps_fma(auVar39,local_14c0,auVar93);
          local_14e0 = vsubps_avx(local_1640,auVar74);
          fVar100 = local_14e0._0_4_;
          fVar103 = local_14e0._4_4_;
          auVar40._4_4_ = auVar93._4_4_ * fVar103;
          auVar40._0_4_ = auVar93._0_4_ * fVar100;
          fVar11 = local_14e0._8_4_;
          auVar40._8_4_ = auVar93._8_4_ * fVar11;
          fVar14 = local_14e0._12_4_;
          auVar40._12_4_ = auVar93._12_4_ * fVar14;
          fVar17 = local_14e0._16_4_;
          auVar40._16_4_ = auVar93._16_4_ * fVar17;
          fVar20 = local_14e0._20_4_;
          auVar40._20_4_ = auVar93._20_4_ * fVar20;
          fVar23 = local_14e0._24_4_;
          auVar40._24_4_ = auVar93._24_4_ * fVar23;
          auVar40._28_4_ = auVar93._28_4_;
          auVar112._0_4_ = local_1640._0_4_ + auVar74._0_4_;
          auVar112._4_4_ = local_1640._4_4_ + auVar74._4_4_;
          auVar112._8_4_ = local_1640._8_4_ + auVar74._8_4_;
          auVar112._12_4_ = local_1640._12_4_ + auVar74._12_4_;
          auVar112._16_4_ = local_1640._16_4_ + auVar74._16_4_;
          auVar112._20_4_ = local_1640._20_4_ + auVar74._20_4_;
          auVar112._24_4_ = local_1640._24_4_ + auVar74._24_4_;
          auVar112._28_4_ = local_1640._28_4_ + auVar74._28_4_;
          auVar31 = vfmsub231ps_fma(auVar40,local_1500,auVar112);
          fVar101 = local_14c0._0_4_;
          fVar104 = local_14c0._4_4_;
          auVar41._4_4_ = auVar112._4_4_ * fVar104;
          auVar41._0_4_ = auVar112._0_4_ * fVar101;
          fVar12 = local_14c0._8_4_;
          auVar41._8_4_ = auVar112._8_4_ * fVar12;
          fVar15 = local_14c0._12_4_;
          auVar41._12_4_ = auVar112._12_4_ * fVar15;
          fVar18 = local_14c0._16_4_;
          auVar41._16_4_ = auVar112._16_4_ * fVar18;
          fVar21 = local_14c0._20_4_;
          auVar41._20_4_ = auVar112._20_4_ * fVar21;
          fVar24 = local_14c0._24_4_;
          auVar41._24_4_ = auVar112._24_4_ * fVar24;
          auVar41._28_4_ = auVar112._28_4_;
          auVar32 = vfmsub231ps_fma(auVar41,local_14e0,auVar98);
          auVar42._4_4_ = auVar32._4_4_ * local_14a0;
          auVar42._0_4_ = auVar32._0_4_ * local_14a0;
          auVar42._8_4_ = auVar32._8_4_ * local_14a0;
          auVar42._12_4_ = auVar32._12_4_ * local_14a0;
          auVar42._16_4_ = local_14a0 * 0.0;
          auVar42._20_4_ = local_14a0 * 0.0;
          auVar42._24_4_ = local_14a0 * 0.0;
          auVar42._28_4_ = fVar115;
          auVar31 = vfmadd231ps_fma(auVar42,auVar109,ZEXT1632(auVar31));
          auVar31 = vfmadd231ps_fma(ZEXT1632(auVar31),local_1840,ZEXT1632(auVar82));
          auVar28 = vsubps_avx(auVar74,auVar25);
          auVar85._0_4_ = auVar74._0_4_ + auVar25._0_4_;
          auVar85._4_4_ = auVar74._4_4_ + auVar25._4_4_;
          auVar85._8_4_ = auVar74._8_4_ + auVar25._8_4_;
          auVar85._12_4_ = auVar74._12_4_ + auVar25._12_4_;
          auVar85._16_4_ = auVar74._16_4_ + auVar25._16_4_;
          auVar85._20_4_ = auVar74._20_4_ + auVar25._20_4_;
          auVar85._24_4_ = auVar74._24_4_ + auVar25._24_4_;
          auVar85._28_4_ = auVar74._28_4_ + auVar25._28_4_;
          auVar25 = vsubps_avx(auVar83,auVar26);
          auVar99._0_4_ = auVar83._0_4_ + auVar26._0_4_;
          auVar99._4_4_ = auVar83._4_4_ + auVar26._4_4_;
          auVar99._8_4_ = auVar83._8_4_ + auVar26._8_4_;
          auVar99._12_4_ = auVar83._12_4_ + auVar26._12_4_;
          auVar99._16_4_ = auVar83._16_4_ + auVar26._16_4_;
          auVar99._20_4_ = auVar83._20_4_ + auVar26._20_4_;
          auVar99._24_4_ = auVar83._24_4_ + auVar26._24_4_;
          auVar99._28_4_ = auVar83._28_4_ + auVar26._28_4_;
          auVar26 = vsubps_avx(auVar81,auVar27);
          auVar78._0_4_ = auVar81._0_4_ + auVar27._0_4_;
          auVar78._4_4_ = auVar81._4_4_ + auVar27._4_4_;
          auVar78._8_4_ = auVar81._8_4_ + auVar27._8_4_;
          auVar78._12_4_ = auVar81._12_4_ + auVar27._12_4_;
          auVar78._16_4_ = auVar81._16_4_ + auVar27._16_4_;
          auVar78._20_4_ = auVar81._20_4_ + auVar27._20_4_;
          auVar78._24_4_ = auVar81._24_4_ + auVar27._24_4_;
          auVar78._28_4_ = fVar115 + fVar116;
          auVar43._4_4_ = auVar26._4_4_ * auVar99._4_4_;
          auVar43._0_4_ = auVar26._0_4_ * auVar99._0_4_;
          auVar43._8_4_ = auVar26._8_4_ * auVar99._8_4_;
          auVar43._12_4_ = auVar26._12_4_ * auVar99._12_4_;
          auVar43._16_4_ = auVar26._16_4_ * auVar99._16_4_;
          auVar43._20_4_ = auVar26._20_4_ * auVar99._20_4_;
          auVar43._24_4_ = auVar26._24_4_ * auVar99._24_4_;
          auVar43._28_4_ = fVar116;
          auVar32 = vfmsub231ps_fma(auVar43,auVar25,auVar78);
          auVar44._4_4_ = auVar78._4_4_ * auVar28._4_4_;
          auVar44._0_4_ = auVar78._0_4_ * auVar28._0_4_;
          auVar44._8_4_ = auVar78._8_4_ * auVar28._8_4_;
          auVar44._12_4_ = auVar78._12_4_ * auVar28._12_4_;
          auVar44._16_4_ = auVar78._16_4_ * auVar28._16_4_;
          auVar44._20_4_ = auVar78._20_4_ * auVar28._20_4_;
          auVar44._24_4_ = auVar78._24_4_ * auVar28._24_4_;
          auVar44._28_4_ = auVar78._28_4_;
          auVar82 = vfmsub231ps_fma(auVar44,auVar26,auVar85);
          auVar45._4_4_ = auVar25._4_4_ * auVar85._4_4_;
          auVar45._0_4_ = auVar25._0_4_ * auVar85._0_4_;
          auVar45._8_4_ = auVar25._8_4_ * auVar85._8_4_;
          auVar45._12_4_ = auVar25._12_4_ * auVar85._12_4_;
          auVar45._16_4_ = auVar25._16_4_ * auVar85._16_4_;
          auVar45._20_4_ = auVar25._20_4_ * auVar85._20_4_;
          auVar45._24_4_ = auVar25._24_4_ * auVar85._24_4_;
          auVar45._28_4_ = auVar85._28_4_;
          auVar33 = vfmsub231ps_fma(auVar45,auVar28,auVar99);
          auVar86._0_4_ = local_14a0 * auVar33._0_4_;
          auVar86._4_4_ = local_14a0 * auVar33._4_4_;
          auVar86._8_4_ = local_14a0 * auVar33._8_4_;
          auVar86._12_4_ = local_14a0 * auVar33._12_4_;
          auVar86._16_4_ = local_14a0 * 0.0;
          auVar86._20_4_ = local_14a0 * 0.0;
          auVar86._24_4_ = local_14a0 * 0.0;
          auVar86._28_4_ = 0;
          auVar82 = vfmadd231ps_fma(auVar86,auVar109,ZEXT1632(auVar82));
          auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),local_1840,ZEXT1632(auVar32));
          local_13c0 = auVar73._0_4_;
          fStack_13bc = auVar73._4_4_;
          fStack_13b8 = auVar73._8_4_;
          fStack_13b4 = auVar73._12_4_;
          local_1380 = ZEXT1632(CONCAT412(auVar82._12_4_ + fStack_13b4 + auVar31._12_4_,
                                          CONCAT48(auVar82._8_4_ + fStack_13b8 + auVar31._8_4_,
                                                   CONCAT44(auVar82._4_4_ +
                                                            fStack_13bc + auVar31._4_4_,
                                                            auVar82._0_4_ +
                                                            local_13c0 + auVar31._0_4_))));
          auVar79._8_4_ = 0x7fffffff;
          auVar79._0_8_ = 0x7fffffff7fffffff;
          auVar79._12_4_ = 0x7fffffff;
          auVar79._16_4_ = 0x7fffffff;
          auVar79._20_4_ = 0x7fffffff;
          auVar79._24_4_ = 0x7fffffff;
          auVar79._28_4_ = 0x7fffffff;
          local_1520 = ZEXT1632(auVar73);
          auVar74 = vminps_avx(local_1520,ZEXT1632(auVar31));
          auVar74 = vminps_avx(auVar74,ZEXT1632(auVar82));
          local_1540 = vandps_avx(local_1380,auVar79);
          fVar111 = local_1540._0_4_ * 1.1920929e-07;
          fVar115 = local_1540._4_4_ * 1.1920929e-07;
          auVar46._4_4_ = fVar115;
          auVar46._0_4_ = fVar111;
          fVar116 = local_1540._8_4_ * 1.1920929e-07;
          auVar46._8_4_ = fVar116;
          fVar117 = local_1540._12_4_ * 1.1920929e-07;
          auVar46._12_4_ = fVar117;
          fVar118 = local_1540._16_4_ * 1.1920929e-07;
          auVar46._16_4_ = fVar118;
          fVar119 = local_1540._20_4_ * 1.1920929e-07;
          auVar46._20_4_ = fVar119;
          fVar120 = local_1540._24_4_ * 1.1920929e-07;
          auVar46._24_4_ = fVar120;
          auVar46._28_4_ = 0x34000000;
          auVar107._0_8_ = CONCAT44(fVar115,fVar111) ^ 0x8000000080000000;
          auVar107._8_4_ = -fVar116;
          auVar107._12_4_ = -fVar117;
          auVar107._16_4_ = -fVar118;
          auVar107._20_4_ = -fVar119;
          auVar107._24_4_ = -fVar120;
          auVar107._28_4_ = 0xb4000000;
          auVar74 = vcmpps_avx(auVar74,auVar107,5);
          auVar81 = vmaxps_avx(local_1520,ZEXT1632(auVar31));
          auVar83 = vmaxps_avx(auVar81,ZEXT1632(auVar82));
          auVar83 = vcmpps_avx(auVar83,auVar46,2);
          auVar83 = vorps_avx(auVar74,auVar83);
          fVar120 = fStack_171c;
          fVar124 = fStack_1718;
          fVar125 = fStack_1714;
          fVar126 = fStack_1710;
          fVar127 = fStack_170c;
          fVar128 = fStack_1708;
          fVar117 = local_1720;
          fVar130 = fStack_173c;
          fVar131 = fStack_1738;
          fVar132 = fStack_1734;
          fVar133 = fStack_1730;
          fVar134 = fStack_172c;
          fVar135 = fStack_1728;
          fVar118 = local_1740;
          fVar136 = fStack_175c;
          fVar137 = fStack_1758;
          fVar138 = fStack_1754;
          fVar139 = fStack_1750;
          fVar140 = fStack_174c;
          fVar141 = fStack_1748;
          fVar119 = local_1760;
          fVar143 = fStack_177c;
          fVar144 = fStack_1778;
          fVar145 = fStack_1774;
          fVar146 = fStack_1770;
          fVar147 = fStack_176c;
          fVar148 = fStack_1768;
          fVar111 = local_1780;
          fVar150 = fStack_179c;
          fVar151 = fStack_1798;
          fVar152 = fStack_1794;
          fVar153 = fStack_1790;
          fVar154 = fStack_178c;
          fVar155 = fStack_1788;
          fVar115 = local_17a0;
          fVar157 = fStack_17bc;
          fVar158 = fStack_17b8;
          fVar159 = fStack_17b4;
          fVar160 = fStack_17b0;
          fVar161 = fStack_17ac;
          fVar162 = fStack_17a8;
          fVar116 = local_17c0;
          if ((((((((auVar83 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar83 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar83 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar83 >> 0x7f,0) == '\0') &&
                (auVar83 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar83 >> 0xbf,0) == '\0') &&
              (auVar83 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar83[0x1f]) {
LAB_006680da:
            auVar110 = ZEXT3264(local_16c0);
            auVar114 = ZEXT3264(local_16e0);
            auVar122 = ZEXT3264(local_1700);
            auVar90 = ZEXT3264(local_1680);
            auVar95 = ZEXT3264(local_16a0);
          }
          else {
            auVar47._4_4_ = fVar104 * local_1460._4_4_;
            auVar47._0_4_ = fVar101 * local_1460._0_4_;
            auVar47._8_4_ = fVar12 * local_1460._8_4_;
            auVar47._12_4_ = fVar15 * local_1460._12_4_;
            auVar47._16_4_ = fVar18 * local_1460._16_4_;
            auVar47._20_4_ = fVar21 * local_1460._20_4_;
            auVar47._24_4_ = fVar24 * local_1460._24_4_;
            auVar47._28_4_ = auVar74._28_4_;
            auVar48._4_4_ = fVar103 * local_1480._4_4_;
            auVar48._0_4_ = fVar100 * local_1480._0_4_;
            auVar48._8_4_ = fVar11 * local_1480._8_4_;
            auVar48._12_4_ = fVar14 * local_1480._12_4_;
            auVar48._16_4_ = fVar17 * local_1480._16_4_;
            auVar48._20_4_ = fVar20 * local_1480._20_4_;
            auVar48._24_4_ = fVar23 * local_1480._24_4_;
            auVar48._28_4_ = 0x34000000;
            auVar73 = vfmsub213ps_fma(local_1480,local_1500,auVar47);
            auVar49._4_4_ = auVar25._4_4_ * fVar102;
            auVar49._0_4_ = auVar25._0_4_ * fVar96;
            auVar49._8_4_ = auVar25._8_4_ * fVar105;
            auVar49._12_4_ = auVar25._12_4_ * fVar13;
            auVar49._16_4_ = auVar25._16_4_ * fVar16;
            auVar49._20_4_ = auVar25._20_4_ * fVar19;
            auVar49._24_4_ = auVar25._24_4_ * fVar22;
            auVar49._28_4_ = auVar81._28_4_;
            auVar50._4_4_ = fVar103 * auVar26._4_4_;
            auVar50._0_4_ = fVar100 * auVar26._0_4_;
            auVar50._8_4_ = fVar11 * auVar26._8_4_;
            auVar50._12_4_ = fVar14 * auVar26._12_4_;
            auVar50._16_4_ = fVar17 * auVar26._16_4_;
            auVar50._20_4_ = fVar20 * auVar26._20_4_;
            auVar50._24_4_ = fVar23 * auVar26._24_4_;
            auVar50._28_4_ = local_1540._28_4_;
            auVar82 = vfmsub213ps_fma(auVar26,local_14c0,auVar49);
            auVar74 = vandps_avx(auVar47,auVar79);
            auVar81 = vandps_avx(auVar49,auVar79);
            auVar74 = vcmpps_avx(auVar74,auVar81,1);
            local_1360 = vblendvps_avx(ZEXT1632(auVar82),ZEXT1632(auVar73),auVar74);
            auVar51._4_4_ = fVar104 * auVar28._4_4_;
            auVar51._0_4_ = fVar101 * auVar28._0_4_;
            auVar51._8_4_ = fVar12 * auVar28._8_4_;
            auVar51._12_4_ = fVar15 * auVar28._12_4_;
            auVar51._16_4_ = fVar18 * auVar28._16_4_;
            auVar51._20_4_ = fVar21 * auVar28._20_4_;
            auVar51._24_4_ = fVar24 * auVar28._24_4_;
            auVar51._28_4_ = auVar74._28_4_;
            auVar73 = vfmsub213ps_fma(auVar28,local_1500,auVar50);
            auVar52._4_4_ = local_1440._4_4_ * fVar102;
            auVar52._0_4_ = local_1440._0_4_ * fVar96;
            auVar52._8_4_ = local_1440._8_4_ * fVar105;
            auVar52._12_4_ = local_1440._12_4_ * fVar13;
            auVar52._16_4_ = local_1440._16_4_ * fVar16;
            auVar52._20_4_ = local_1440._20_4_ * fVar19;
            auVar52._24_4_ = local_1440._24_4_ * fVar22;
            auVar52._28_4_ = auVar81._28_4_;
            auVar82 = vfmsub213ps_fma(local_1460,local_14e0,auVar52);
            auVar74 = vandps_avx(auVar52,auVar79);
            auVar81 = vandps_avx(auVar50,auVar79);
            auVar74 = vcmpps_avx(auVar74,auVar81,1);
            local_1340 = vblendvps_avx(ZEXT1632(auVar73),ZEXT1632(auVar82),auVar74);
            auVar73 = vfmsub213ps_fma(local_1440,local_14c0,auVar48);
            auVar82 = vfmsub213ps_fma(auVar25,local_14e0,auVar51);
            auVar74 = vandps_avx(auVar48,auVar79);
            auVar81 = vandps_avx(auVar51,auVar79);
            auVar74 = vcmpps_avx(auVar74,auVar81,1);
            local_1320 = vblendvps_avx(ZEXT1632(auVar82),ZEXT1632(auVar73),auVar74);
            auVar73 = vpackssdw_avx(auVar83._0_16_,auVar83._16_16_);
            fVar96 = local_1320._0_4_;
            auVar80._0_4_ = fVar96 * local_14a0;
            fVar100 = local_1320._4_4_;
            auVar80._4_4_ = fVar100 * local_14a0;
            fVar101 = local_1320._8_4_;
            auVar80._8_4_ = fVar101 * local_14a0;
            fVar102 = local_1320._12_4_;
            auVar80._12_4_ = fVar102 * local_14a0;
            fVar103 = local_1320._16_4_;
            auVar80._16_4_ = fVar103 * local_14a0;
            fVar104 = local_1320._20_4_;
            auVar80._20_4_ = fVar104 * local_14a0;
            fVar105 = local_1320._24_4_;
            auVar80._24_4_ = fVar105 * local_14a0;
            auVar80._28_4_ = 0;
            auVar82 = vfmadd213ps_fma(auVar109,local_1340,auVar80);
            auVar82 = vfmadd213ps_fma(local_1840,local_1360,ZEXT1632(auVar82));
            auVar81 = ZEXT1632(CONCAT412(auVar82._12_4_ + auVar82._12_4_,
                                         CONCAT48(auVar82._8_4_ + auVar82._8_4_,
                                                  CONCAT44(auVar82._4_4_ + auVar82._4_4_,
                                                           auVar82._0_4_ + auVar82._0_4_))));
            auVar53._4_4_ = fVar100 * fVar5;
            auVar53._0_4_ = fVar96 * fVar4;
            auVar53._8_4_ = fVar101 * fVar6;
            auVar53._12_4_ = fVar102 * fVar7;
            auVar53._16_4_ = fVar103 * fVar8;
            auVar53._20_4_ = fVar104 * fVar9;
            auVar53._24_4_ = fVar105 * fVar10;
            auVar53._28_4_ = auVar83._28_4_;
            auVar82 = vfmadd213ps_fma(local_1660,local_1340,auVar53);
            auVar32 = vfmadd213ps_fma(local_1640,local_1360,ZEXT1632(auVar82));
            auVar74 = vrcpps_avx(auVar81);
            auVar123._8_4_ = 0x3f800000;
            auVar123._0_8_ = &DAT_3f8000003f800000;
            auVar123._12_4_ = 0x3f800000;
            auVar123._16_4_ = 0x3f800000;
            auVar123._20_4_ = 0x3f800000;
            auVar123._24_4_ = 0x3f800000;
            auVar123._28_4_ = 0x3f800000;
            auVar82 = vfnmadd213ps_fma(auVar74,auVar81,auVar123);
            auVar82 = vfmadd132ps_fma(ZEXT1632(auVar82),auVar74,auVar74);
            local_12a0 = ZEXT1632(CONCAT412(auVar82._12_4_ * (auVar32._12_4_ + auVar32._12_4_),
                                            CONCAT48(auVar82._8_4_ * (auVar32._8_4_ + auVar32._8_4_)
                                                     ,CONCAT44(auVar82._4_4_ *
                                                               (auVar32._4_4_ + auVar32._4_4_),
                                                               auVar82._0_4_ *
                                                               (auVar32._0_4_ + auVar32._0_4_)))));
            uVar70 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar113._4_4_ = uVar70;
            auVar113._0_4_ = uVar70;
            auVar113._8_4_ = uVar70;
            auVar113._12_4_ = uVar70;
            auVar113._16_4_ = uVar70;
            auVar113._20_4_ = uVar70;
            auVar113._24_4_ = uVar70;
            auVar113._28_4_ = uVar70;
            uVar70 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar121._4_4_ = uVar70;
            auVar121._0_4_ = uVar70;
            auVar121._8_4_ = uVar70;
            auVar121._12_4_ = uVar70;
            auVar121._16_4_ = uVar70;
            auVar121._20_4_ = uVar70;
            auVar121._24_4_ = uVar70;
            auVar121._28_4_ = uVar70;
            auVar74 = vcmpps_avx(auVar113,local_12a0,2);
            auVar83 = vcmpps_avx(local_12a0,auVar121,2);
            auVar74 = vandps_avx(auVar74,auVar83);
            auVar82 = vpackssdw_avx(auVar74._0_16_,auVar74._16_16_);
            auVar73 = vpand_avx(auVar82,auVar73);
            auVar74 = vpmovsxwd_avx2(auVar73);
            if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar74 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar74 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar74 >> 0x7f,0) == '\0') &&
                  (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar74 >> 0xbf,0) == '\0') &&
                (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar74[0x1f]) goto LAB_006680da;
            auVar74 = vcmpps_avx(auVar81,_DAT_02020f00,4);
            auVar82 = vpackssdw_avx(auVar74._0_16_,auVar74._16_16_);
            auVar73 = vpand_avx(auVar73,auVar82);
            local_1300 = vpmovsxwd_avx2(auVar73);
            if ((((((((local_1300 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_1300 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_1300 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_1300 >> 0x7f,0) == '\0') &&
                  (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_1300 >> 0xbf,0) == '\0') &&
                (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_1300[0x1f]) goto LAB_006680da;
            uStack_13b0 = 0;
            uStack_13ac = 0;
            uStack_13a8 = 0;
            uStack_13a4 = 0;
            local_13a0 = ZEXT1632(auVar31);
            local_1220 = local_1560;
            auStack_1818 = auVar109._8_24_;
            local_1820 = context->scene;
            auVar74 = vrcpps_avx(local_1380);
            auVar94._8_4_ = 0x3f800000;
            auVar94._0_8_ = &DAT_3f8000003f800000;
            auVar94._12_4_ = 0x3f800000;
            auVar94._16_4_ = 0x3f800000;
            auVar94._20_4_ = 0x3f800000;
            auVar94._24_4_ = 0x3f800000;
            auVar94._28_4_ = 0x3f800000;
            auVar82 = vfnmadd213ps_fma(local_1380,auVar74,auVar94);
            auVar82 = vfmadd132ps_fma(ZEXT1632(auVar82),auVar74,auVar74);
            auVar87._8_4_ = 0x219392ef;
            auVar87._0_8_ = 0x219392ef219392ef;
            auVar87._12_4_ = 0x219392ef;
            auVar87._16_4_ = 0x219392ef;
            auVar87._20_4_ = 0x219392ef;
            auVar87._24_4_ = 0x219392ef;
            auVar87._28_4_ = 0x219392ef;
            auVar74 = vcmpps_avx(local_1540,auVar87,5);
            auVar74 = vandps_avx(auVar74,ZEXT1632(auVar82));
            auVar54._4_4_ = fStack_13bc * auVar74._4_4_;
            auVar54._0_4_ = local_13c0 * auVar74._0_4_;
            auVar54._8_4_ = fStack_13b8 * auVar74._8_4_;
            auVar54._12_4_ = fStack_13b4 * auVar74._12_4_;
            auVar54._16_4_ = auVar74._16_4_ * 0.0;
            auVar54._20_4_ = auVar74._20_4_ * 0.0;
            auVar54._24_4_ = auVar74._24_4_ * 0.0;
            auVar54._28_4_ = 0;
            auVar83 = vminps_avx(auVar54,auVar94);
            auVar55._4_4_ = auVar31._4_4_ * auVar74._4_4_;
            auVar55._0_4_ = auVar31._0_4_ * auVar74._0_4_;
            auVar55._8_4_ = auVar31._8_4_ * auVar74._8_4_;
            auVar55._12_4_ = auVar31._12_4_ * auVar74._12_4_;
            auVar55._16_4_ = auVar74._16_4_ * 0.0;
            auVar55._20_4_ = auVar74._20_4_ * 0.0;
            auVar55._24_4_ = auVar74._24_4_ * 0.0;
            auVar55._28_4_ = auVar74._28_4_;
            auVar74 = vminps_avx(auVar55,auVar94);
            auVar81 = vsubps_avx(auVar94,auVar83);
            auVar25 = vsubps_avx(auVar94,auVar74);
            local_12c0 = vblendvps_avx(auVar74,auVar81,local_1560);
            local_12e0 = vblendvps_avx(auVar83,auVar25,local_1560);
            local_1260._4_4_ = (float)local_1580._4_4_ * local_1340._4_4_;
            local_1260._0_4_ = (float)local_1580._0_4_ * local_1340._0_4_;
            local_1260._8_4_ = fStack_1578 * local_1340._8_4_;
            local_1260._12_4_ = fStack_1574 * local_1340._12_4_;
            local_1260._16_4_ = fStack_1570 * local_1340._16_4_;
            local_1260._20_4_ = fStack_156c * local_1340._20_4_;
            local_1260._24_4_ = fStack_1568 * local_1340._24_4_;
            local_1260._28_4_ = local_12c0._28_4_;
            local_1280[0] = local_1360._0_4_ * (float)local_1580._0_4_;
            local_1280[1] = local_1360._4_4_ * (float)local_1580._4_4_;
            local_1280[2] = local_1360._8_4_ * fStack_1578;
            local_1280[3] = local_1360._12_4_ * fStack_1574;
            fStack_1270 = local_1360._16_4_ * fStack_1570;
            fStack_126c = local_1360._20_4_ * fStack_156c;
            fStack_1268 = local_1360._24_4_ * fStack_1568;
            uStack_1264 = local_12e0._28_4_;
            local_1240[0] = (float)local_1580._0_4_ * fVar96;
            local_1240[1] = (float)local_1580._4_4_ * fVar100;
            local_1240[2] = fStack_1578 * fVar101;
            local_1240[3] = fStack_1574 * fVar102;
            fStack_1230 = fStack_1570 * fVar103;
            fStack_122c = fStack_156c * fVar104;
            fStack_1228 = fStack_1568 * fVar105;
            uStack_1224 = uStack_1564;
            auVar73 = vpacksswb_avx(auVar73,auVar73);
            uVar60 = (ulong)(byte)(SUB161(auVar73 >> 7,0) & 1 | (SUB161(auVar73 >> 0xf,0) & 1) << 1
                                   | (SUB161(auVar73 >> 0x17,0) & 1) << 2 |
                                   (SUB161(auVar73 >> 0x1f,0) & 1) << 3 |
                                   (SUB161(auVar73 >> 0x27,0) & 1) << 4 |
                                   (SUB161(auVar73 >> 0x2f,0) & 1) << 5 |
                                   (SUB161(auVar73 >> 0x37,0) & 1) << 6 |
                                  SUB161(auVar73 >> 0x3f,0) << 7);
            auVar110 = ZEXT3264(local_16c0);
            auVar114 = ZEXT3264(local_16e0);
            auVar122 = ZEXT3264(local_1700);
            auVar90 = ZEXT3264(local_1680);
            auVar95 = ZEXT3264(local_16a0);
            fStack_149c = local_14a0;
            fStack_1498 = local_14a0;
            fStack_1494 = local_14a0;
            fStack_1490 = local_14a0;
            fStack_148c = local_14a0;
            fStack_1488 = local_14a0;
            fStack_1484 = local_14a0;
            do {
              uVar29 = 0;
              for (uVar30 = uVar60; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
                uVar29 = uVar29 + 1;
              }
              uVar69 = *(uint *)((long)&local_13e0 + uVar29 * 4);
              lVar62 = *(long *)(*(long *)((long)local_1820 + 0x1e8) + (ulong)uVar69 * 8);
              if ((*(uint *)(lVar62 + 0x34) & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                uVar60 = uVar60 ^ 1L << (uVar29 & 0x3f);
                bVar72 = true;
              }
              else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                      (*(long *)(lVar62 + 0x48) == 0)) {
                bVar72 = false;
              }
              else {
                local_1840._0_8_ = uVar63;
                local_1640._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                uVar63 = (ulong)(uint)((int)uVar29 * 4);
                uVar70 = *(undefined4 *)(local_12e0 + uVar63);
                local_15e0._4_4_ = uVar70;
                local_15e0._0_4_ = uVar70;
                local_15e0._8_4_ = uVar70;
                local_15e0._12_4_ = uVar70;
                uVar70 = *(undefined4 *)(local_12c0 + uVar63);
                local_15d0._4_4_ = uVar70;
                local_15d0._0_4_ = uVar70;
                local_15d0._8_4_ = uVar70;
                local_15d0._12_4_ = uVar70;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_12a0 + uVar63);
                local_17f0.context = context->user;
                local_15b0._4_4_ = uVar69;
                local_15b0._0_4_ = uVar69;
                local_15b0._8_4_ = uVar69;
                local_15b0._12_4_ = uVar69;
                local_15c0 = *(undefined4 *)((long)&local_1400 + uVar63);
                local_1610 = *(undefined4 *)((long)local_1280 + uVar63);
                uVar70 = *(undefined4 *)(local_1260 + uVar63);
                local_1600._4_4_ = uVar70;
                local_1600._0_4_ = uVar70;
                local_1600._8_4_ = uVar70;
                local_1600._12_4_ = uVar70;
                uVar70 = *(undefined4 *)((long)local_1240 + uVar63);
                local_15f0._4_4_ = uVar70;
                local_15f0._0_4_ = uVar70;
                local_15f0._8_4_ = uVar70;
                local_15f0._12_4_ = uVar70;
                vpcmpeqd_avx2(ZEXT1632(local_15b0),ZEXT1632(local_15b0));
                uStack_159c = (local_17f0.context)->instID[0];
                local_15a0 = uStack_159c;
                uStack_1598 = uStack_159c;
                uStack_1594 = uStack_159c;
                uStack_1590 = (local_17f0.context)->instPrimID[0];
                uStack_158c = uStack_1590;
                uStack_1588 = uStack_1590;
                uStack_1584 = uStack_1590;
                local_1870 = *local_1860;
                uStack_1868 = local_1860[1];
                local_17f0.valid = (int *)&local_1870;
                local_17f0.geometryUserPtr = *(void **)(lVar62 + 0x18);
                local_17f0.hit = (RTCHitN *)&local_1610;
                local_17f0.N = 4;
                local_17f0.ray = (RTCRayN *)ray;
                uStack_160c = local_1610;
                uStack_1608 = local_1610;
                uStack_1604 = local_1610;
                uStack_15bc = local_15c0;
                uStack_15b8 = local_15c0;
                uStack_15b4 = local_15c0;
                if (*(code **)(lVar62 + 0x48) != (code *)0x0) {
                  local_1660._0_8_ = k;
                  (**(code **)(lVar62 + 0x48))(&local_17f0);
                  auVar122 = ZEXT3264(local_1700);
                  auVar114 = ZEXT3264(local_16e0);
                  auVar110 = ZEXT3264(local_16c0);
                  k = local_1660._0_8_;
                  fVar117 = local_1720;
                  fVar120 = fStack_171c;
                  fVar124 = fStack_1718;
                  fVar125 = fStack_1714;
                  fVar126 = fStack_1710;
                  fVar127 = fStack_170c;
                  fVar128 = fStack_1708;
                  fVar118 = local_1740;
                  fVar130 = fStack_173c;
                  fVar131 = fStack_1738;
                  fVar132 = fStack_1734;
                  fVar133 = fStack_1730;
                  fVar134 = fStack_172c;
                  fVar135 = fStack_1728;
                  fVar119 = local_1760;
                  fVar136 = fStack_175c;
                  fVar137 = fStack_1758;
                  fVar138 = fStack_1754;
                  fVar139 = fStack_1750;
                  fVar140 = fStack_174c;
                  fVar141 = fStack_1748;
                  fVar111 = local_1780;
                  fVar143 = fStack_177c;
                  fVar144 = fStack_1778;
                  fVar145 = fStack_1774;
                  fVar146 = fStack_1770;
                  fVar147 = fStack_176c;
                  fVar148 = fStack_1768;
                  fVar115 = local_17a0;
                  fVar150 = fStack_179c;
                  fVar151 = fStack_1798;
                  fVar152 = fStack_1794;
                  fVar153 = fStack_1790;
                  fVar154 = fStack_178c;
                  fVar155 = fStack_1788;
                  fVar116 = local_17c0;
                  fVar157 = fStack_17bc;
                  fVar158 = fStack_17b8;
                  fVar159 = fStack_17b4;
                  fVar160 = fStack_17b0;
                  fVar161 = fStack_17ac;
                  fVar162 = fStack_17a8;
                }
                auVar73._8_8_ = uStack_1868;
                auVar73._0_8_ = local_1870;
                auVar90 = ZEXT3264(local_1680);
                auVar95 = ZEXT3264(local_16a0);
                if (auVar73 == (undefined1  [16])0x0) {
                  auVar73 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                  auVar73 = auVar73 ^ _DAT_01febe20;
                  uVar63 = local_1840._0_8_;
                }
                else {
                  p_Var3 = context->args->filter;
                  if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || ((*(byte *)(lVar62 + 0x3e) & 0x40) != 0))))
                  {
                    (*p_Var3)(&local_17f0);
                    auVar95 = ZEXT3264(local_16a0);
                    auVar90 = ZEXT3264(local_1680);
                    auVar122 = ZEXT3264(local_1700);
                    auVar114 = ZEXT3264(local_16e0);
                    auVar110 = ZEXT3264(local_16c0);
                    fVar117 = local_1720;
                    fVar120 = fStack_171c;
                    fVar124 = fStack_1718;
                    fVar125 = fStack_1714;
                    fVar126 = fStack_1710;
                    fVar127 = fStack_170c;
                    fVar128 = fStack_1708;
                    fVar118 = local_1740;
                    fVar130 = fStack_173c;
                    fVar131 = fStack_1738;
                    fVar132 = fStack_1734;
                    fVar133 = fStack_1730;
                    fVar134 = fStack_172c;
                    fVar135 = fStack_1728;
                    fVar119 = local_1760;
                    fVar136 = fStack_175c;
                    fVar137 = fStack_1758;
                    fVar138 = fStack_1754;
                    fVar139 = fStack_1750;
                    fVar140 = fStack_174c;
                    fVar141 = fStack_1748;
                    fVar111 = local_1780;
                    fVar143 = fStack_177c;
                    fVar144 = fStack_1778;
                    fVar145 = fStack_1774;
                    fVar146 = fStack_1770;
                    fVar147 = fStack_176c;
                    fVar148 = fStack_1768;
                    fVar115 = local_17a0;
                    fVar150 = fStack_179c;
                    fVar151 = fStack_1798;
                    fVar152 = fStack_1794;
                    fVar153 = fStack_1790;
                    fVar154 = fStack_178c;
                    fVar155 = fStack_1788;
                    fVar116 = local_17c0;
                    fVar157 = fStack_17bc;
                    fVar158 = fStack_17b8;
                    fVar159 = fStack_17b4;
                    fVar160 = fStack_17b0;
                    fVar161 = fStack_17ac;
                    fVar162 = fStack_17a8;
                  }
                  auVar31._8_8_ = uStack_1868;
                  auVar31._0_8_ = local_1870;
                  auVar31 = vpcmpeqd_avx((undefined1  [16])0x0,auVar31);
                  auVar73 = auVar31 ^ _DAT_01febe20;
                  auVar82._8_4_ = 0xff800000;
                  auVar82._0_8_ = 0xff800000ff800000;
                  auVar82._12_4_ = 0xff800000;
                  auVar31 = vblendvps_avx(auVar82,*(undefined1 (*) [16])(local_17f0.ray + 0x80),
                                          auVar31);
                  *(undefined1 (*) [16])(local_17f0.ray + 0x80) = auVar31;
                  uVar63 = local_1840._0_8_;
                }
                auVar73 = vpslld_avx(auVar73,0x1f);
                bVar58 = (auVar73 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                bVar59 = (auVar73 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                bVar57 = (auVar73 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                bVar56 = -1 < auVar73[0xf];
                bVar72 = ((bVar58 && bVar59) && bVar57) && bVar56;
                if (((bVar58 && bVar59) && bVar57) && bVar56) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_1640._0_4_;
                  uVar60 = uVar60 ^ 1L << (uVar29 & 0x3f);
                }
              }
              uVar69 = 0;
              if (!bVar72) {
                if (bVar71) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                  uVar69 = 1;
                }
                goto LAB_00668160;
              }
            } while (uVar60 != 0);
          }
          uVar69 = 0;
          uVar64 = uVar64 + 1;
          bVar71 = uVar64 < local_1858;
        } while (uVar64 != local_1858);
      }
    }
LAB_00668160:
  } while ((uVar69 & 3) == 0);
  return local_1850 != &local_1200;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }